

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::create_pipeline(DeconvolutionDepthWise_x86 *this,Option *opt)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int _h;
  int *piVar4;
  Allocator *pAVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  int k;
  ulong uVar11;
  int iVar12;
  int _w;
  ulong uVar13;
  Mat local_c8;
  Mat local_78;
  
  if ((this->super_DeconvolutionDepthWise).dynamic_weight == 0) {
    uVar13 = (long)(this->super_DeconvolutionDepthWise).kernel_h *
             (long)(this->super_DeconvolutionDepthWise).kernel_w;
    uVar2 = (this->super_DeconvolutionDepthWise).num_output;
    uVar3 = (this->super_DeconvolutionDepthWise).group;
    uVar7 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)(int)uVar3;
    _w = (int)uVar13;
    uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) / (long)_w;
    if ((uVar3 == uVar2) &&
       ((int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
             (long)((int)uVar2 / (int)uVar3)) * uVar3 == uVar3)) {
      bVar1 = opt->use_packing_layout;
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8.elemsize._4_4_ = 0;
      local_c8.elempack = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      iVar12 = 0;
      Mat::create(&local_c8,(this->super_DeconvolutionDepthWise).weight_data.w,4,(Allocator *)0x0);
      pvVar9 = (this->super_DeconvolutionDepthWise).weight_data.data;
      _h = (this->super_DeconvolutionDepthWise).group;
      iVar6 = (uVar3 - (int)uVar3 % _h) * ((this->super_DeconvolutionDepthWise).num_output / _h);
      uVar7 = 0;
      if (0 < _w) {
        uVar7 = uVar13 & 0xffffffff;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      pvVar8 = local_c8.data;
      for (; iVar12 != iVar6; iVar12 = iVar12 + 1) {
        iVar10 = _w;
        for (uVar11 = 0; iVar10 = iVar10 + -1, uVar7 != uVar11; uVar11 = uVar11 + 1) {
          *(undefined4 *)((long)pvVar8 + (long)iVar10 * 4) =
               *(undefined4 *)((long)pvVar9 + uVar11 * 4);
        }
        pvVar8 = (void *)((long)pvVar8 + uVar13 * 4);
        pvVar9 = (void *)((long)pvVar9 + uVar13 * 4);
      }
      if (((uVar3 & 3) == 0) && (bVar1 != false)) {
        Mat::reshape(&local_78,&local_c8,_w,_h,(Allocator *)0x0);
        convert_packing(&local_78,&this->weight_data_tm,4,opt);
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              free(local_78.data);
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (&this->weight_data_tm != &local_c8) {
        piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = (this->weight_data_tm).refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pAVar5 = (this->weight_data_tm).allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free((this->weight_data_tm).data);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).data = local_c8.data;
        (this->weight_data_tm).refcount =
             (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        (this->weight_data_tm).elemsize =
             CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
        (this->weight_data_tm).elempack = local_c8.elempack;
        (this->weight_data_tm).allocator = local_c8.allocator;
        (this->weight_data_tm).dims = local_c8.dims;
        (this->weight_data_tm).w = local_c8.w;
        (this->weight_data_tm).h = local_c8.h;
        (this->weight_data_tm).d = local_c8.d;
        (this->weight_data_tm).c = local_c8.c;
        (this->weight_data_tm).cstep = local_c8.cstep;
      }
      if (opt->lightmode == true) {
        piVar4 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pAVar5 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free((this->super_DeconvolutionDepthWise).weight_data.data);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
        (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
        (this->super_DeconvolutionDepthWise).weight_data.w = 0;
        (this->super_DeconvolutionDepthWise).weight_data.h = 0;
        (this->super_DeconvolutionDepthWise).weight_data.d = 0;
        (this->super_DeconvolutionDepthWise).weight_data.c = 0;
      }
      piVar4 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      create_group_ops(this,opt);
      if (opt->lightmode == true) {
        piVar4 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            pAVar5 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
            if (pAVar5 == (Allocator *)0x0) {
              free((this->super_DeconvolutionDepthWise).weight_data.data);
            }
            else {
              (*pAVar5->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
        (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
        (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
        (this->super_DeconvolutionDepthWise).weight_data.w = 0;
        (this->super_DeconvolutionDepthWise).weight_data.h = 0;
        (this->super_DeconvolutionDepthWise).weight_data.d = 0;
        (this->super_DeconvolutionDepthWise).weight_data.c = 0;
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}